

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mySet.cpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
mySet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_myComparator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::extract(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
         mySet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_myComparator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,iterator *position)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  long lVar5;
  out_of_range *this_00;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = position->pos;
  if (pbVar1 != this->data + (long)this->data_size + 1) {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
    iVar4 = count(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pbVar1 = this->data;
    if (iVar4 == 1) {
      pbVar3 = position->pos;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar3->_M_string_length);
      std::__cxx11::string::_M_assign((string *)position->pos);
      lVar5 = 0;
      if (pbVar3 != pbVar1 + 1) {
        lVar5 = (long)(int)((ulong)((long)pbVar3 - (long)(pbVar1 + 1)) >> 5);
      }
      lVar6 = lVar5 + -1;
      lVar5 = lVar5 << 5;
      while( true ) {
        lVar6 = lVar6 + 1;
        if (this->data_size < lVar6) break;
        std::__cxx11::string::_M_assign((string *)((long)&(this->data->_M_dataplus)._M_p + lVar5));
        lVar5 = lVar5 + 0x20;
      }
      this->data_size = this->data_size + -1;
    }
    else {
      iVar4 = this->data_size;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = pbVar1[(long)iVar4 + 1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,
                 pcVar2 + pbVar1[(long)iVar4 + 1]._M_string_length);
    }
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

typename mySet<T, C>::iterator mySet<T, C>::end() const
{
    return mySetIterator(&data[data_size+1]);
}